

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_set_cookie(http_s *h,http_cookie_args_s cookie)

{
  http_settings_s *phVar1;
  size_t sVar2;
  long lVar3;
  FIOBJ FVar4;
  fio_str_info_s local_d8;
  FIOBJ local_c0;
  FIOBJ tmp_2;
  size_t local_b0;
  char *local_a8;
  fio_str_info_s local_a0;
  ulong local_88;
  size_t tmp_1;
  size_t local_78;
  char *local_70;
  fio_str_info_s local_68;
  ulong local_50;
  size_t tmp;
  fio_str_info_s t;
  FIOBJ c;
  size_t len;
  size_t capa;
  http_s *h_local;
  
  if ((h == (http_s *)0x0) ||
     ((((h->method == 0 && (h->status_str == 0)) && (h->status != 0)) ||
      ((0x7fff < cookie.name_len || (0x1ffff < cookie.value_len)))))) {
    h_local._4_4_ = -1;
  }
  else {
    len = cookie.name_len + cookie.value_len + 0x80;
    c = 0;
    t.data = (char *)fiobj_str_buf(len);
    fiobj_obj2cstr((fio_str_info_s *)&tmp,(FIOBJ)t.data);
    if (cookie.name != (char *)0x0) {
      local_50 = 0;
      if (cookie.name_len == 0) {
        while (cookie.name[local_50] != '\0') {
          if (invalid_cookie_name_char[(byte)cookie.name[local_50]] == '\0') {
            *(char *)(t.len + c) = cookie.name[local_50];
            c = c + 1;
          }
          else {
            if ((http_set_cookie::warn_illegal == 0) &&
               (http_set_cookie::warn_illegal = 1, 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)cookie.name[local_50],cookie.name);
            }
            *(undefined1 *)(t.len + c) = 0x25;
            *(char *)(t.len + c + 1) =
                 "0123456789ABCDEF"[(int)(uint)(byte)cookie.name[local_50] >> 4];
            *(char *)(t.len + c + 2) = "0123456789ABCDEF"[(int)((byte)cookie.name[local_50] & 0xf)];
            c = c + 3;
          }
          local_50 = local_50 + 1;
          if (len <= c + 3) {
            len = len + 0x20;
            fiobj_str_capa_assert((FIOBJ)t.data,len);
            fiobj_obj2cstr((fio_str_info_s *)&tmp_1,(FIOBJ)t.data);
            tmp = tmp_1;
            t.capa = local_78;
            t.len = (size_t)local_70;
          }
        }
      }
      else {
        while (local_50 < cookie.name_len) {
          if (invalid_cookie_name_char[(byte)cookie.name[local_50]] == '\0') {
            *(char *)(t.len + c) = cookie.name[local_50];
            c = c + 1;
          }
          else {
            if ((http_set_cookie::warn_illegal == 0) &&
               (http_set_cookie::warn_illegal = 1, 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)cookie.name[local_50],cookie.name);
            }
            *(undefined1 *)(t.len + c) = 0x25;
            *(char *)(t.len + c + 1) =
                 "0123456789ABCDEF"[(int)(uint)(byte)cookie.name[local_50] >> 4];
            *(char *)(t.len + c + 2) = "0123456789ABCDEF"[(int)((byte)cookie.name[local_50] & 0xf)];
            c = c + 3;
          }
          local_50 = local_50 + 1;
          if (len <= c + 3) {
            len = len + 0x20;
            fiobj_str_capa_assert((FIOBJ)t.data,len);
            fiobj_obj2cstr(&local_68,(FIOBJ)t.data);
            tmp = local_68.capa;
            t.capa = local_68.len;
            t.len = (size_t)local_68.data;
          }
        }
      }
    }
    FVar4 = c + 1;
    *(undefined1 *)(t.len + c) = 0x3d;
    c = FVar4;
    if (cookie.value != (char *)0x0) {
      local_88 = 0;
      if (cookie.value_len == 0) {
        while (cookie.value[local_88] != '\0') {
          if (invalid_cookie_value_char[(byte)cookie.value[local_88]] == '\0') {
            *(char *)(t.len + c) = cookie.value[local_88];
            c = c + 1;
          }
          else {
            if ((http_set_cookie::warn_illegal == 0) &&
               (http_set_cookie::warn_illegal = 1, 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)cookie.value[local_88],cookie.value);
            }
            *(undefined1 *)(t.len + c) = 0x25;
            *(char *)(t.len + c + 1) =
                 "0123456789ABCDEF"[(int)(uint)(byte)cookie.value[local_88] >> 4];
            *(char *)(t.len + c + 2) = "0123456789ABCDEF"[(int)((byte)cookie.value[local_88] & 0xf)]
            ;
            c = c + 3;
          }
          local_88 = local_88 + 1;
          if (len <= c + 3) {
            len = len + 0x20;
            fiobj_str_capa_assert((FIOBJ)t.data,len);
            fiobj_obj2cstr((fio_str_info_s *)&tmp_2,(FIOBJ)t.data);
            tmp = tmp_2;
            t.capa = local_b0;
            t.len = (size_t)local_a8;
          }
        }
      }
      else {
        while (local_88 < cookie.value_len) {
          if (invalid_cookie_value_char[(byte)cookie.value[local_88]] == '\0') {
            *(char *)(t.len + c) = cookie.value[local_88];
            c = c + 1;
          }
          else {
            if ((http_set_cookie::warn_illegal == 0) &&
               (http_set_cookie::warn_illegal = 1, 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)cookie.value[local_88],cookie.value);
            }
            *(undefined1 *)(t.len + c) = 0x25;
            *(char *)(t.len + c + 1) =
                 "0123456789ABCDEF"[(int)(uint)(byte)cookie.value[local_88] >> 4];
            *(char *)(t.len + c + 2) = "0123456789ABCDEF"[(int)((byte)cookie.value[local_88] & 0xf)]
            ;
            c = c + 3;
          }
          local_88 = local_88 + 1;
          if (len <= c + 3) {
            len = len + 0x20;
            fiobj_str_capa_assert((FIOBJ)t.data,len);
            fiobj_obj2cstr(&local_a0,(FIOBJ)t.data);
            tmp = local_a0.capa;
            t.capa = local_a0.len;
            t.len = (size_t)local_a0.data;
          }
        }
      }
    }
    phVar1 = http_settings(h);
    if ((phVar1 == (http_settings_s *)0x0) || (phVar1 = http_settings(h), phVar1->is_client == '\0')
       ) {
      *(undefined1 *)(t.len + c) = 0x3b;
      *(undefined1 *)(t.len + c + 1) = 0x20;
      if ((h->status_str == 0) && (h->status != 0)) {
        if (len <= c + 0x2a) {
          fiobj_str_capa_assert((FIOBJ)t.data,c + 0x2a);
          fiobj_obj2cstr(&local_d8,(FIOBJ)t.data);
          tmp = local_d8.capa;
          t.capa = local_d8.len;
          t.len = (size_t)local_d8.data;
        }
        FVar4 = c + 2;
        if (cookie.max_age != 0) {
          builtin_strncpy((char *)(t.len + c + 2),"Max-Age=",8);
          sVar2 = fio_ltoa((char *)(t.len + c + 10),(long)cookie.max_age,'\n');
          lVar3 = sVar2 + c + 10;
          *(undefined1 *)(t.len + lVar3) = 0x3b;
          *(undefined1 *)(t.len + lVar3 + 1) = 0x20;
          FVar4 = lVar3 + 2;
        }
        c = FVar4;
        fiobj_str_resize((FIOBJ)t.data,c);
        if ((cookie.domain != (char *)0x0) && (cookie.domain_len != 0)) {
          fiobj_str_write((FIOBJ)t.data,"domain=",7);
          fiobj_str_write((FIOBJ)t.data,cookie.domain,cookie.domain_len);
          fiobj_str_write((FIOBJ)t.data,";",1);
          *(undefined1 *)(t.len + c) = 0x20;
          c = c + 1;
        }
        if ((cookie.path != (char *)0x0) && (cookie.path_len != 0)) {
          fiobj_str_write((FIOBJ)t.data,"path=",5);
          fiobj_str_write((FIOBJ)t.data,cookie.path,cookie.path_len);
          fiobj_str_write((FIOBJ)t.data,";",1);
          *(undefined1 *)(t.len + c) = 0x20;
        }
        if (((byte)cookie._68_1_ >> 1 & 1) != 0) {
          fiobj_str_write((FIOBJ)t.data,"HttpOnly;",9);
        }
        if (((undefined1  [72])cookie & (undefined1  [72])0x100000000) != (undefined1  [72])0x0) {
          fiobj_str_write((FIOBJ)t.data,"secure;",7);
        }
        set_header_add((h->private_data).out_headers,HTTP_HEADER_SET_COOKIE,(FIOBJ)t.data);
        h_local._4_4_ = 0;
      }
      else {
        if (http_set_cookie::cookie_hash == 0) {
          http_set_cookie::cookie_hash = fiobj_hash_string("cookie",6);
        }
        local_c0 = fiobj_hash_get2((h->private_data).out_headers,http_set_cookie::cookie_hash);
        if (local_c0 == 0) {
          set_header_add((h->private_data).out_headers,HTTP_HEADER_COOKIE,(FIOBJ)t.data);
        }
        else {
          fiobj_str_concat(local_c0,(FIOBJ)t.data);
          fiobj_free((FIOBJ)t.data);
        }
        h_local._4_4_ = 0;
      }
    }
    else if (cookie.value == (char *)0x0) {
      fiobj_free((FIOBJ)t.data);
      h_local._4_4_ = -1;
    }
    else {
      set_header_add((h->private_data).out_headers,HTTP_HEADER_COOKIE,(FIOBJ)t.data);
      h_local._4_4_ = 0;
    }
  }
  return h_local._4_4_;
}

Assistant:

int http_set_cookie(http_s *h, http_cookie_args_s cookie) {
#if DEBUG
  FIO_ASSERT(h, "Can't set cookie for NULL HTTP handler!");
#endif
  if (HTTP_INVALID_HANDLE(h) || cookie.name_len >= 32768 ||
      cookie.value_len >= 131072) {
    return -1;
  }

  static int warn_illegal = 0;

  /* write name and value while auto-correcting encoding issues */
  size_t capa = cookie.name_len + cookie.value_len + 128;
  size_t len = 0;
  FIOBJ c = fiobj_str_buf(capa);
  fio_str_info_s t = fiobj_obj2cstr(c);

#define copy_cookie_ch(ch_var)                                                 \
  if (invalid_cookie_##ch_var##_char[(uint8_t)cookie.ch_var[tmp]]) {           \
    if (!warn_illegal) {                                                       \
      ++warn_illegal;                                                          \
      FIO_LOG_WARNING("illegal char 0x%.2x in cookie " #ch_var " (in %s)\n"    \
                      "         automatic %% encoding applied",                \
                      cookie.ch_var[tmp], cookie.ch_var);                      \
    }                                                                          \
    t.data[len++] = '%';                                                       \
    t.data[len++] = hex_chars[((uint8_t)cookie.ch_var[tmp] >> 4) & 0x0F];      \
    t.data[len++] = hex_chars[(uint8_t)cookie.ch_var[tmp] & 0x0F];             \
  } else {                                                                     \
    t.data[len++] = cookie.ch_var[tmp];                                        \
  }                                                                            \
  tmp += 1;                                                                    \
  if (capa <= len + 3) {                                                       \
    capa += 32;                                                                \
    fiobj_str_capa_assert(c, capa);                                            \
    t = fiobj_obj2cstr(c);                                                     \
  }

  if (cookie.name) {
    size_t tmp = 0;
    if (cookie.name_len) {
      while (tmp < cookie.name_len) {
        copy_cookie_ch(name);
      }
    } else {
      while (cookie.name[tmp]) {
        copy_cookie_ch(name);
      }
    }
  }
  t.data[len++] = '=';
  if (cookie.value) {
    size_t tmp = 0;
    if (cookie.value_len) {
      while (tmp < cookie.value_len) {
        copy_cookie_ch(value);
      }
    } else {
      while (cookie.value[tmp]) {
        copy_cookie_ch(value);
      }
    }
  } else
    cookie.max_age = -1;

  if (http_settings(h) && http_settings(h)->is_client) {
    if (!cookie.value) {
      fiobj_free(c);
      return -1;
    }
    set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    return 0;
  }

  t.data[len++] = ';';
  t.data[len++] = ' ';

  if (h->status_str || !h->status) { /* on first request status == 0 */
    static uint64_t cookie_hash;
    if (!cookie_hash)
      cookie_hash = fiobj_hash_string("cookie", 6);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, cookie_hash);
    if (!tmp) {
      set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    } else {
      fiobj_str_join(tmp, c);
      fiobj_free(c);
    }
    return 0;
  }

  if (capa <= len + 40) {
    capa = len + 40;
    fiobj_str_capa_assert(c, capa);
    t = fiobj_obj2cstr(c);
  }
  if (cookie.max_age) {
    memcpy(t.data + len, "Max-Age=", 8);
    len += 8;
    len += fio_ltoa(t.data + len, cookie.max_age, 10);
    t.data[len++] = ';';
    t.data[len++] = ' ';
  }
  fiobj_str_resize(c, len);

  if (cookie.domain && cookie.domain_len) {
    fiobj_str_write(c, "domain=", 7);
    fiobj_str_write(c, cookie.domain, cookie.domain_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.path && cookie.path_len) {
    fiobj_str_write(c, "path=", 5);
    fiobj_str_write(c, cookie.path, cookie.path_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.http_only) {
    fiobj_str_write(c, "HttpOnly;", 9);
  }
  if (cookie.secure) {
    fiobj_str_write(c, "secure;", 7);
  }
  set_header_add(h->private_data.out_headers, HTTP_HEADER_SET_COOKIE, c);
  return 0;
}